

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O0

bool cppforth::Forth::isValidDigit(Char c,int numericBase)

{
  bool local_11;
  int numericBase_local;
  Char c_local;
  
  if (10 < numericBase) {
    if ((0x40 < c) && ((int)(uint)c < numericBase + 0x37)) {
      return true;
    }
    if ((0x60 < c) && ((int)(uint)c < numericBase + 0x57)) {
      return true;
    }
  }
  local_11 = 0x2f < c && (int)(uint)c < numericBase + 0x30;
  return local_11;
}

Assistant:

static bool isValidDigit(Char c, int numericBase) {
			if (numericBase > 10) {
				if (('A' <= c) && (c < ('A' + numericBase - 10)))
					return true;
				if (('a' <= c) && (c < ('a' + numericBase - 10)))
					return true;
			}
			return ('0' <= c) && (c < ('0' + numericBase));
		}